

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabBestIndexMethod(sqlite3_vtab *pUnused,sqlite3_index_info *pInfo)

{
  sqlite3_index_constraint *psVar1;
  sqlite3_index_constraint *p;
  int nArg;
  int idxNum;
  int iTermLe;
  int iTermGe;
  int iTermEq;
  int i;
  sqlite3_index_info *pInfo_local;
  sqlite3_vtab *pUnused_local;
  
  iTermEq = -1;
  iTermGe = -1;
  iTermLe = -1;
  idxNum = (int)pInfo->colUsed;
  for (i = 0; i < pInfo->nConstraint; i = i + 1) {
    psVar1 = pInfo->aConstraint + i;
    if ((psVar1->usable != '\0') && (psVar1->iColumn == 0)) {
      if (psVar1->op == '\x02') {
        iTermEq = i;
      }
      if (psVar1->op == '\b') {
        iTermLe = i;
      }
      if (psVar1->op == '\x10') {
        iTermLe = i;
      }
      if (psVar1->op == ' ') {
        iTermGe = i;
      }
      if (psVar1->op == '\x04') {
        iTermGe = i;
      }
    }
  }
  if (iTermEq < 0) {
    pInfo->estimatedCost = 1000000.0;
    if (-1 < iTermGe) {
      idxNum = idxNum | 0x200;
      pInfo->aConstraintUsage[iTermGe].argvIndex = 1;
      pInfo->estimatedCost = pInfo->estimatedCost / 2.0;
    }
    nArg = (int)(-1 < iTermGe);
    if (-1 < iTermLe) {
      idxNum = idxNum | 0x400;
      pInfo->aConstraintUsage[iTermLe].argvIndex = nArg + 1;
      pInfo->estimatedCost = pInfo->estimatedCost / 2.0;
    }
  }
  else {
    idxNum = idxNum | 0x100;
    pInfo->aConstraintUsage[iTermEq].argvIndex = 1;
    pInfo->estimatedCost = 100.0;
  }
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  pInfo->idxNum = idxNum;
  return 0;
}

Assistant:

static int fts5VocabBestIndexMethod(
  sqlite3_vtab *pUnused,
  sqlite3_index_info *pInfo
){
  int i;
  int iTermEq = -1;
  int iTermGe = -1;
  int iTermLe = -1;
  int idxNum = (int)pInfo->colUsed;
  int nArg = 0;

  UNUSED_PARAM(pUnused);

  assert( (pInfo->colUsed & FTS5_VOCAB_COLUSED_MASK)==pInfo->colUsed );

  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    if( p->usable==0 ) continue;
    if( p->iColumn==0 ){          /* term column */
      if( p->op==SQLITE_INDEX_CONSTRAINT_EQ ) iTermEq = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LE ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LT ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GE ) iTermGe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GT ) iTermGe = i;
    }
  }

  if( iTermEq>=0 ){
    idxNum |= FTS5_VOCAB_TERM_EQ;
    pInfo->aConstraintUsage[iTermEq].argvIndex = ++nArg;
    pInfo->estimatedCost = 100;
  }else{
    pInfo->estimatedCost = 1000000;
    if( iTermGe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_GE;
      pInfo->aConstraintUsage[iTermGe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
    if( iTermLe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_LE;
      pInfo->aConstraintUsage[iTermLe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
  }

  /* This virtual table always delivers results in ascending order of
  ** the "term" column (column 0). So if the user has requested this
  ** specifically - "ORDER BY term" or "ORDER BY term ASC" - set the
  ** sqlite3_index_info.orderByConsumed flag to tell the core the results
  ** are already in sorted order.  */
  if( pInfo->nOrderBy==1
   && pInfo->aOrderBy[0].iColumn==0
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  pInfo->idxNum = idxNum;
  return SQLITE_OK;
}